

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O2

int Bmc_GiaGenerateJust_rec(Gia_Man_t *p,int iFrame,int iObj,Vec_Bit_t *vValues,Vec_Bit_t *vJustis)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  int Entry;
  char *__assertion;
  int i;
  
LAB_00483a1e:
  do {
    if (iFrame < 0) {
      return 0;
    }
    i = p->nObjs * iFrame + iObj;
    iVar1 = Vec_BitEntry(vJustis,i);
    if (iVar1 != 0) {
      return 0;
    }
    Vec_BitWriteEntry(vJustis,i,Entry);
    pGVar3 = Gia_ManObj(p,iObj);
    uVar4 = *(ulong *)pGVar3;
    uVar2 = (uint)uVar4;
    if ((uVar4 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar2) {
      if ((~uVar2 & 0x9fffffff) == 0) {
        iFrame = iFrame + -1;
        pGVar3 = Gia_ObjRoToRi(p,pGVar3);
        iObj = Gia_ObjId(p,pGVar3);
        goto LAB_00483a1e;
      }
      if (((int)uVar2 < 0) || ((int)(uVar4 & 0x1fffffff) == 0x1fffffff)) {
        __assertion = "Gia_ObjIsAnd(pObj)";
        uVar2 = 0x3d;
LAB_00483b73:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                      ,uVar2,
                      "int Bmc_GiaGenerateJust_rec(Gia_Man_t *, int, int, Vec_Bit_t *, Vec_Bit_t *)"
                     );
      }
      iVar1 = Vec_BitEntry(vValues,i);
      if (iVar1 == 0) {
        uVar2 = Vec_BitEntry(vValues,i - (*(uint *)pGVar3 & 0x1fffffff));
        uVar4 = *(ulong *)pGVar3;
        if (uVar2 != (((uint)uVar4 >> 0x1d & 1) != 0)) {
          uVar2 = Vec_BitEntry(vValues,i - ((uint)(uVar4 >> 0x20) & 0x1fffffff));
          if (uVar2 != ((*(ulong *)pGVar3 >> 0x3d & 1) != 0)) {
            __assertion = "0";
            uVar2 = 0x47;
            goto LAB_00483b73;
          }
          uVar4 = *(ulong *)pGVar3 >> 0x20;
        }
      }
      else {
        Bmc_GiaGenerateJust_rec(p,iFrame,iObj - (*(uint *)pGVar3 & 0x1fffffff),vValues,vJustis);
        uVar4 = (ulong)*(uint *)&pGVar3->field_0x4;
      }
    }
    iObj = iObj - ((uint)uVar4 & 0x1fffffff);
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Generate justifying assignments.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Bmc_GiaGenerateJust_rec( Gia_Man_t * p, int iFrame, int iObj, Vec_Bit_t * vValues, Vec_Bit_t * vJustis )
{
    Gia_Obj_t * pObj;
    int Shift = Gia_ManObjNum(p) * iFrame;
    if ( iFrame < 0 )
        return 0;
    assert( iFrame >= 0 );
    if ( Vec_BitEntry( vJustis, Shift + iObj ) )
        return 0;
    Vec_BitWriteEntry( vJustis, Shift + iObj, 1 );
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCo(pObj) )
        return Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId0(pObj, iObj), vValues, vJustis );
    if ( Gia_ObjIsCi(pObj) )
        return Bmc_GiaGenerateJust_rec( p, iFrame-1, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)), vValues, vJustis );
    assert( Gia_ObjIsAnd(pObj) );
    if ( Vec_BitEntry( vValues, Shift + iObj ) )
    {
        Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId0(pObj, iObj), vValues, vJustis );
        Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId1(pObj, iObj), vValues, vJustis );
    }
    else if ( Vec_BitEntry( vValues, Shift + Gia_ObjFaninId0(pObj, iObj) ) == Gia_ObjFaninC0(pObj) )
        Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId0(pObj, iObj), vValues, vJustis );
    else if ( Vec_BitEntry( vValues, Shift + Gia_ObjFaninId1(pObj, iObj) ) == Gia_ObjFaninC1(pObj) )
        Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId1(pObj, iObj), vValues, vJustis );
    else assert( 0 );
    return 0;
}